

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Bdd __thiscall
sylvan::Bdd::VectorCube(Bdd *this,vector<sylvan::Bdd,_std::allocator<sylvan::Bdd>_> *variables)

{
  bool bVar1;
  uint uVar2;
  TD_sylvan_and *t;
  long lVar3;
  long lVar4;
  Task local_68;
  
  this->bdd = 0x8000000000000000;
  mtbdd_protect(&this->bdd);
  uVar2 = (int)((ulong)(*(long *)(variables + 8) - *(long *)variables) >> 3) - 1;
  if (-1 < (int)uVar2) {
    local_68.d._0_8_ = this->bdd;
    lVar3 = (ulong)uVar2 + 1;
    do {
      local_68.d._8_8_ = *(undefined8 *)(*(long *)variables + -8 + lVar3 * 8);
      local_68.f = sylvan_and_WRAP;
      local_68.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
      local_68.d[0x10] = '\0';
      local_68.d[0x11] = '\0';
      local_68.d[0x12] = '\0';
      local_68.d[0x13] = '\0';
      lace_run_task(&local_68);
      lVar4 = lVar3 + -1;
      this->bdd = local_68.d._0_8_;
      bVar1 = 0 < lVar3;
      lVar3 = lVar4;
    } while (lVar4 != 0 && bVar1);
  }
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::VectorCube(const std::vector<Bdd> variables)
{
    Bdd result = Bdd::bddOne();
    for (int i=variables.size()-1; i>=0; i--) {
        result *= variables[i];
    }
    return result;
}